

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O2

void __thiscall
tsbp::LeftmostActiveOnly::DomainReductionY(LeftmostActiveOnly *this,size_t domainReducedItemIndex)

{
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  reference pvVar5;
  size_t j;
  pointer pRVar6;
  ulong pos;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  int iVar10;
  allocator<unsigned_long> local_89;
  LeftmostActiveOnly *local_88;
  double local_78;
  double dStack_70;
  int iStack_68;
  int iStack_64;
  size_t local_60;
  size_t local_58;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  
  this_00 = &this->itemSpecificPlacementPointsY;
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::reserve(this_00,(long)(this->items).
                          super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->items).
                          super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 5);
  pRVar6 = (this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar1 = (this->container).super_Rectangle.Dx;
  uVar3 = (this->container).super_Rectangle.Dy;
  uVar2 = pRVar6[domainReducedItemIndex].Dx;
  uVar4 = pRVar6[domainReducedItemIndex].Dy;
  local_78 = (double)(int)(uVar1 - uVar2) * 0.5;
  dStack_70 = (double)(int)(uVar3 - uVar4) * 0.5;
  local_58 = domainReducedItemIndex;
  local_88 = (LeftmostActiveOnly *)floor(local_78);
  dVar9 = floor(dStack_70);
  iVar10 = (int)(double)local_88;
  iStack_68 = (int)dVar9;
  local_60 = (size_t)((iStack_68 + 1) * (iVar10 + 1));
  uVar8 = (ulong)iStack_68;
  iStack_64 = -(uint)(iStack_68 < 0);
  local_78 = (double)CONCAT44(-(uint)(iVar10 < 0),iVar10);
  uVar7 = 0;
  local_88 = this;
  while( true ) {
    if ((ulong)((long)(local_88->items).
                      super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pRVar6 >> 5) <= uVar7) {
      return;
    }
    if (uVar7 != (long)pRVar6[uVar7].InternId) break;
    if (uVar7 == local_58) {
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (&local_50,(long)(local_88->container).super_Rectangle.Dy,0,&local_89);
      pvVar5 = std::
               vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
               ::emplace_back<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>
                         ((vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
                           *)this_00,&local_50);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                (&local_50);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset(pvVar5);
      for (pos = 0; pos <= uVar8; pos = pos + 1) {
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set(pvVar5,pos,true);
      }
      local_88->reducedItemDomainX = (size_t)local_78;
      local_88->reducedItemDomainY = (size_t)dStack_70;
      local_88->reducedItemFeasiblePlacementPoints = local_60;
    }
    else {
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (&local_50,(long)(local_88->container).super_Rectangle.Dy,0,&local_89);
      pvVar5 = std::
               vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
               ::emplace_back<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>
                         ((vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
                           *)this_00,&local_50);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                (&local_50);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set(pvVar5);
    }
    uVar7 = uVar7 + 1;
    pRVar6 = (local_88->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  __assert_fail("item.InternId == i",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/tsbp/src/BranchAndBound.cpp"
                ,0x83,"void tsbp::LeftmostActiveOnly::DomainReductionY(const size_t)");
}

Assistant:

void LeftmostActiveOnly::DomainReductionY(const size_t domainReducedItemIndex)
{
    itemSpecificPlacementPointsY.reserve(this->items.size());

    int reducedDomainThresholdX = std::floor((this->container.Dx - this->items[domainReducedItemIndex].Dx) / 2.0);
    int reducedDomainThresholdY = std::floor((this->container.Dy - this->items[domainReducedItemIndex].Dy) / 2.0);

    for (size_t i = 0; i < this->items.size(); i++)
    {
        const Rectangle& item = this->items[i];
        assert(item.InternId == i);

        if (i == domainReducedItemIndex)
        {
            auto& bitsetY = this->itemSpecificPlacementPointsY.emplace_back(boost::dynamic_bitset<>(this->container.Dy));
            bitsetY.reset();

            for (size_t j = 0; j <= reducedDomainThresholdY; j++)
            {
                bitsetY.set(j);
            }

            this->reducedItemDomainX = reducedDomainThresholdX;
            this->reducedItemDomainY = reducedDomainThresholdY;
            this->reducedItemFeasiblePlacementPoints = (reducedDomainThresholdX + 1) * (reducedDomainThresholdY + 1);

            continue;
        }

        // TODO: reduce by item.Dy to exclude overlap with the container. Enables simplification of no-overlap checks.
        auto& bitsetY = this->itemSpecificPlacementPointsY.emplace_back(boost::dynamic_bitset<>(this->container.Dy));
        bitsetY.set();
    }
}